

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->BeginCount == pIVar1->BeginCountPreviousFrame) && (GImGui->NavMoveDir == 0)) {
    pIVar2 = pIVar1->ParentWindow;
    bVar5 = NavMoveRequestButNoResultYet();
    if ((bVar5) &&
       (((pIVar3 = pIVar4->NavWindow, pIVar3 != (ImGuiWindow *)0x0 &&
         (pIVar3->RootWindowForNav == pIVar1)) && ((pIVar2->DC).LayoutType == 1)))) {
      ClosePopupToLevel((pIVar4->BeginPopupStack).Size + -1,true);
      NavMoveRequestCancel();
    }
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request our menu failed, close ourselves.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginMenu()/EndMenu() calls
    ImGuiWindow* parent_window = window->ParentWindow;  // Should always be != NULL is we passed assert.
    if (window->BeginCount == window->BeginCountPreviousFrame)
        if (g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet())
            if (g.NavWindow && (g.NavWindow->RootWindowForNav == window) && parent_window->DC.LayoutType == ImGuiLayoutType_Vertical)
            {
                ClosePopupToLevel(g.BeginPopupStack.Size - 1, true);
                NavMoveRequestCancel();
            }

    EndPopup();
}